

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O3

int Str_NtkBalanceTwo(Gia_Man_t *pNew,Str_Ntk_t *p,Str_Obj_t *pObj,int i,int j,Vec_Int_t *vDelay,
                     int *pCost,int *pSuper,word *pMatrix,int nSize,int nLutSize,int CostBest)

{
  undefined1 auVar1 [16];
  uint uVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  undefined1 auVar6 [16];
  
  if (j <= i) {
    __assert_fail("i < j",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStr.c"
                  ,0x420,
                  "int Str_NtkBalanceTwo(Gia_Man_t *, Str_Ntk_t *, Str_Obj_t *, int, int, Vec_Int_t *, int *, int *, word *, int, int, int)"
                 );
  }
  lVar5 = (long)j;
  if (((undefined1  [16])*pObj & (undefined1  [16])0xf) == (undefined1  [16])0x3) {
    uVar2 = Gia_ManHashAnd(pNew,pSuper[i],pSuper[lVar5]);
  }
  else {
    uVar2 = Gia_ManHashXorReal(pNew,pSuper[i],pSuper[lVar5]);
  }
  if (-1 < (int)uVar2) {
    iVar3 = Str_ObjDelay(pNew,uVar2 >> 1,nLutSize,vDelay);
    pCost[i] = iVar3;
    pSuper[i] = uVar2;
    pMatrix[i] = pMatrix[i] | pMatrix[lVar5];
    if (j < nSize + -1) {
      do {
        pCost[lVar5] = pCost[lVar5 + 1];
        pSuper[lVar5] = pSuper[lVar5 + 1];
        pMatrix[lVar5] = pMatrix[lVar5 + 1];
        lVar5 = lVar5 + 1;
      } while (nSize + -1 != lVar5);
    }
    if (2 < nSize) {
      uVar4 = 0;
      do {
        iVar3 = pCost[uVar4];
        if (iVar3 <= pCost[uVar4 + 1]) {
          return uVar2;
        }
        pCost[uVar4] = pCost[uVar4 + 1];
        pCost[uVar4 + 1] = iVar3;
        *(ulong *)(pSuper + uVar4) =
             CONCAT44((int)*(undefined8 *)(pSuper + uVar4),
                      (int)((ulong)*(undefined8 *)(pSuper + uVar4) >> 0x20));
        auVar1 = *(undefined1 (*) [16])(pMatrix + uVar4);
        auVar6._0_8_ = auVar1._8_8_;
        auVar6._8_4_ = auVar1._0_4_;
        auVar6._12_4_ = auVar1._4_4_;
        *(undefined1 (*) [16])(pMatrix + uVar4) = auVar6;
        uVar4 = uVar4 + 1;
      } while (nSize - 2 != uVar4);
    }
    return uVar2;
  }
  __assert_fail("Lit >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                ,0x12f,"int Abc_Lit2Var(int)");
}

Assistant:

int Str_NtkBalanceTwo( Gia_Man_t * pNew, Str_Ntk_t * p, Str_Obj_t * pObj, int i, int j, Vec_Int_t * vDelay, int * pCost, int * pSuper, word * pMatrix, int nSize, int nLutSize, int CostBest )
{
    int k, iLitRes, Delay;
    assert( i < j );
//    printf( "Merging node %d and %d\n", i, j );
    if ( pObj->Type == STR_AND )
        iLitRes = Gia_ManHashAnd( pNew, pSuper[i], pSuper[j] );
    else
        iLitRes = Gia_ManHashXorReal( pNew, pSuper[i], pSuper[j] );
    Delay = Str_ObjDelay( pNew, Abc_Lit2Var(iLitRes), nLutSize, vDelay );
    // update
    pCost[i] = Delay;
    pSuper[i] = iLitRes;
    pMatrix[i] |= pMatrix[j];
//    assert( (pCost[i] & 15) == CostBest || CostBest == -1 );
    // remove entry j
    nSize--;
    for ( k = j; k < nSize; k++ )
    {
        pCost[k] = pCost[k+1];
        pSuper[k] = pSuper[k+1];
        pMatrix[k] = pMatrix[k+1];
    }
    // move up the first one
    nSize--;
    for ( k = 0; k < nSize; k++ )
    {
        if ( pCost[k] <= pCost[k+1] )
            break;
        ABC_SWAP( int, pCost[k], pCost[k+1] );
        ABC_SWAP( int, pSuper[k], pSuper[k+1] );
        ABC_SWAP( word, pMatrix[k], pMatrix[k+1] );
    }
    return iLitRes;
}